

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

_Bool createTree(tree_t *tree,uint numLeaves,uint dataSize)

{
  uint32_t uVar1;
  uint uVar2;
  bitset_word_t *pbVar3;
  byte bVar4;
  uint in_EDX;
  uint in_ESI;
  tree_t *in_RDI;
  uint num_nodes;
  uint depth;
  uint8_t *local_28;
  _Bool local_1;
  
  if ((in_RDI == (tree_t *)0x0) || (in_ESI == 0)) {
    local_1 = false;
  }
  else {
    uVar1 = ceil_log2(0x151df3);
    bVar4 = (byte)(uVar1 + 1);
    uVar2 = ((1 << (bVar4 & 0x1f)) + -1) - ((1 << (bVar4 - 1 & 0x1f)) - in_ESI);
    if (in_EDX == 0) {
      local_28 = (uint8_t *)0x0;
    }
    else {
      local_28 = (uint8_t *)calloc((ulong)uVar2,(ulong)in_EDX);
    }
    in_RDI->nodes = local_28;
    pbVar3 = (bitset_word_t *)calloc((ulong)(uVar2 * 2) + 0x3f >> 6,8);
    in_RDI->haveNodeExists = pbVar3;
    if (((in_EDX == 0) || (in_RDI->nodes != (uint8_t *)0x0)) &&
       (in_RDI->haveNodeExists != (bitset_word_t *)0x0)) {
      in_RDI->depth = uVar1 + 1;
      in_RDI->dataSize = in_EDX;
      in_RDI->numNodes = uVar2;
      in_RDI->numLeaves = in_ESI;
      initNodes(in_RDI);
      local_1 = true;
    }
    else {
      clearTree((tree_t *)0x151ea8);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool createTree(tree_t* tree, unsigned int numLeaves, unsigned int dataSize) {
  if (!tree || !numLeaves) {
    return false;
  }

  unsigned int depth = ceil_log2(numLeaves) + 1;
  /* Num nodes in complete - number of missing leaves */
  unsigned int num_nodes = ((1 << depth) - 1) - ((1 << (depth - 1)) - numLeaves);

  tree->nodes = dataSize ? calloc(num_nodes, dataSize) : NULL;
  /* Depending on the number of leaves, the tree may not be complete */
  tree->haveNodeExists =
      calloc((2 * num_nodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if ((dataSize && !tree->nodes) || !tree->haveNodeExists) {
    clearTree(tree);
    return false;
  }

  tree->depth     = depth;
  tree->dataSize  = dataSize;
  tree->numNodes  = num_nodes;
  tree->numLeaves = numLeaves;

  initNodes(tree);
  return true;
}